

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setclassudsize(HSQUIRRELVM v,SQInteger idx,SQInteger udsize)

{
  SQClass *pSVar1;
  SQObjectPtr *pSVar2;
  char *err;
  
  if (idx < 0) {
    pSVar2 = SQVM::GetUp(v,idx);
  }
  else {
    pSVar2 = SQVM::GetAt(v,idx + v->_stackbase + -1);
  }
  if ((pSVar2->super_SQObject)._type == OT_CLASS) {
    pSVar1 = (pSVar2->super_SQObject)._unVal.pClass;
    if (pSVar1->_locked != true) {
      pSVar1->_udsize = udsize;
      return 0;
    }
    err = "the class is locked";
  }
  else {
    err = "the object is not a class";
  }
  sq_throwerror(v,err);
  return -1;
}

Assistant:

SQRESULT sq_setclassudsize(HSQUIRRELVM v, SQInteger idx, SQInteger udsize)
{
    SQObjectPtr &o = stack_get(v,idx);
    if(sq_type(o) != OT_CLASS) return sq_throwerror(v,_SC("the object is not a class"));
    if(_class(o)->_locked) return sq_throwerror(v,_SC("the class is locked"));
    _class(o)->_udsize = udsize;
    return SQ_OK;
}